

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkreply.cpp
# Opt level: O3

void __thiscall QHttpNetworkReply::setDownstreamLimited(QHttpNetworkReply *this,bool dsl)

{
  long lVar1;
  
  lVar1 = *(long *)(this + 8);
  *(bool *)(lVar1 + 0x1bb) = dsl;
  QHttpNetworkConnectionPrivate::readMoreLater
            (*(QHttpNetworkConnectionPrivate **)(*(long *)(lVar1 + 0x170) + 8),
             (QHttpNetworkReply *)this);
  return;
}

Assistant:

void QHttpNetworkReply::setDownstreamLimited(bool dsl)
{
    Q_D(QHttpNetworkReply);
    d->downstreamLimited = dsl;
    d->connection->d_func()->readMoreLater(this);
}